

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinusoidal_linear_chirp_source.cc
# Opt level: O2

void __thiscall
webrtc::SinusoidalLinearChirpSource::SinusoidalLinearChirpSource
          (SinusoidalLinearChirpSource *this,int sample_rate,size_t samples,double max_frequency,
          double delay_samples)

{
  undefined1 auVar1 [16];
  
  (this->super_SincResamplerCallback)._vptr_SincResamplerCallback =
       (_func_int **)&PTR__SincResamplerCallback_001d3df8;
  this->sample_rate_ = sample_rate;
  this->total_samples_ = samples;
  this->max_frequency_ = max_frequency;
  this->current_index_ = 0;
  this->delay_samples_ = delay_samples;
  auVar1._8_4_ = (int)(samples >> 0x20);
  auVar1._0_8_ = samples;
  auVar1._12_4_ = 0x45300000;
  this->k_ = (max_frequency + -5.0) /
             (((auVar1._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)samples) - 4503599627370496.0)) /
             (double)sample_rate);
  return;
}

Assistant:

SinusoidalLinearChirpSource::SinusoidalLinearChirpSource(int sample_rate,
                                                         size_t samples,
                                                         double max_frequency,
                                                         double delay_samples)
    : sample_rate_(sample_rate),
      total_samples_(samples),
      max_frequency_(max_frequency),
      current_index_(0),
      delay_samples_(delay_samples) {
  // Chirp rate.
  double duration = static_cast<double>(total_samples_) / sample_rate_;
  k_ = (max_frequency_ - kMinFrequency) / duration;
}